

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_guardcc(ASMState *as,int cc)

{
  MCLabel target_00;
  MCode *p;
  MCode *target;
  int cc_local;
  ASMState *as_local;
  ptrdiff_t delta;
  
  p = as->J->exitstubgroup[as->snapno >> 5] + ((as->snapno & 0x1f) << 2);
  target_00 = as->mcp;
  target._4_4_ = cc;
  if (target_00 == as->invmcp) {
    as->loopinv = 1;
    *(int *)(target_00 + 1) = (int)p - ((int)target_00 + 5);
    target._4_4_ = cc ^ 1;
    p = target_00;
    if (as->realign != (MCode *)0x0) {
      if ((as->mrm).base == '%') {
        (as->mrm).ofs = (as->mrm).ofs + 2;
      }
      emit_sjcc(as,target._4_4_,target_00);
      return;
    }
  }
  if ((as->mrm).base == '%') {
    (as->mrm).ofs = (as->mrm).ofs + 6;
  }
  emit_jcc(as,target._4_4_,p);
  return;
}

Assistant:

static void asm_guardcc(ASMState *as, int cc)
{
  MCode *target = exitstub_addr(as->J, as->snapno);
  MCode *p = as->mcp;
  if (LJ_UNLIKELY(p == as->invmcp)) {
    as->loopinv = 1;
    *(int32_t *)(p+1) = jmprel(as->J, p+5, target);
    target = p;
    cc ^= 1;
    if (as->realign) {
      if (LJ_GC64 && LJ_UNLIKELY(as->mrm.base == RID_RIP))
	as->mrm.ofs += 2;  /* Fixup RIP offset for pending fused load. */
      emit_sjcc(as, cc, target);
      return;
    }
  }
  if (LJ_GC64 && LJ_UNLIKELY(as->mrm.base == RID_RIP))
    as->mrm.ofs += 6;  /* Fixup RIP offset for pending fused load. */
  emit_jcc(as, cc, target);
}